

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aesni.c
# Opt level: O0

void mbedtls_aesni_inverse_key(uchar *invkey,uchar *fwdkey,int nr)

{
  undefined1 (*pauVar1) [16];
  undefined1 auVar2 [16];
  undefined1 (*local_30) [16];
  uchar *fk;
  uchar *ik;
  int nr_local;
  uchar *fwdkey_local;
  uchar *invkey_local;
  
  pauVar1 = (undefined1 (*) [16])(fwdkey + (nr << 4));
  *(undefined8 *)invkey = *(undefined8 *)*pauVar1;
  *(undefined8 *)(invkey + 8) = *(undefined8 *)(*pauVar1 + 8);
  fk = invkey + 0x10;
  while (local_30 = pauVar1 + -1, fwdkey < local_30) {
    auVar2 = aesimc(*local_30);
    *(undefined1 (*) [16])fk = auVar2;
    fk = fk + 0x10;
    pauVar1 = local_30;
  }
  *(undefined8 *)fk = *(undefined8 *)*local_30;
  *(undefined8 *)(fk + 8) = *(undefined8 *)(pauVar1[-1] + 8);
  return;
}

Assistant:

void mbedtls_aesni_inverse_key( unsigned char *invkey,
                        const unsigned char *fwdkey, int nr )
{
    unsigned char *ik = invkey;
    const unsigned char *fk = fwdkey + 16 * nr;

    memcpy( ik, fk, 16 );

    for( fk -= 16, ik += 16; fk > fwdkey; fk -= 16, ik += 16 )
        asm( "movdqu (%0), %%xmm0       \n\t"
             AESIMC  xmm0_xmm0         "\n\t"
             "movdqu %%xmm0, (%1)       \n\t"
             :
             : "r" (fk), "r" (ik)
             : "memory", "xmm0" );

    memcpy( ik, fk, 16 );
}